

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitInvoke(RegSlot location,RegSlot callObjLocation,PropertyId propertyId,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint16 callSiteId;
  
  EmitMethodFld(false,false,location,callObjLocation,propertyId,byteCodeGenerator,funcInfo,true);
  funcInfo->outArgsDepth = funcInfo->outArgsDepth + 1;
  uVar1 = funcInfo->outArgsCurrentExpr;
  uVar3 = uVar1 + 2;
  funcInfo->outArgsCurrentExpr = uVar3;
  if (uVar1 < 0xfffffffe) {
    if (uVar3 < funcInfo->outArgsMaxDepth) {
      uVar3 = funcInfo->outArgsMaxDepth;
    }
    funcInfo->outArgsMaxDepth = uVar3;
    this = &byteCodeGenerator->m_writer;
    bVar2 = Js::ByteCodeWriter::ShouldIncrementCallSiteId(this,CallI);
    callSiteId = byteCodeGenerator->m_callSiteId;
    if (bVar2) {
      if (callSiteId == 0xffff) {
        callSiteId = 0xffff;
      }
      else {
        byteCodeGenerator->m_callSiteId = callSiteId + 1;
      }
    }
    Js::ByteCodeWriter::StartCall(this,StartCall,1);
    if (callObjLocation != 0xffffffff) {
      Js::ByteCodeWriter::ArgOut<true>(this,0,callObjLocation,callSiteId,false);
    }
    Js::ByteCodeWriter::CallI(this,CallI,location,location,1,callSiteId,CallFlags_None);
    return;
  }
  Js::Throw::OutOfMemory();
}

Assistant:

void EmitInvoke(
    Js::RegSlot location,
    Js::RegSlot callObjLocation,
    Js::PropertyId propertyId,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    EmitMethodFld(false, false, location, callObjLocation, propertyId, byteCodeGenerator, funcInfo);

    funcInfo->StartRecordingOutArgs(1);

    Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);

    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, 1);
    EmitArgListStart(callObjLocation, byteCodeGenerator, funcInfo, callSiteId);

    byteCodeGenerator->Writer()->CallI(Js::OpCode::CallI, location, location, 1, callSiteId);
}